

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileHdrWrapper.cpp
# Opt level: O1

QString * __thiscall
FileHdrWrapper::getFieldName(QString *__return_storage_ptr__,FileHdrWrapper *this,size_t fieldId)

{
  Executable *pEVar1;
  bool bVar2;
  PEFile *this_00;
  storage_type *psVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  switch(fieldId) {
  case 0:
    psVar3 = (storage_type *)0x7;
    break;
  case 1:
    psVar3 = (storage_type *)0xe;
    break;
  case 2:
    pEVar1 = (this->super_PEElementWrapper).super_ExeElementWrapper.m_Exe;
    if (pEVar1 == (Executable *)0x0) {
      this_00 = (PEFile *)0x0;
    }
    else {
      this_00 = (PEFile *)__dynamic_cast(pEVar1,&Executable::typeinfo,&PEFile::typeinfo,0);
    }
    if ((this_00 == (PEFile *)0x0) || (bVar2 = PEFile::isReproBuild(this_00), !bVar2))
    goto LAB_0012a24f;
    psVar3 = (storage_type *)0xd;
    break;
  case 3:
    psVar3 = (storage_type *)0x13;
    break;
  case 4:
    goto LAB_0012a24f;
  case 5:
    psVar3 = (storage_type *)0x16;
    break;
  case 6:
LAB_0012a24f:
    psVar3 = (storage_type *)0xf;
    break;
  default:
    QVar4.m_data = (storage_type *)0x0;
    QVar4.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar4);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    goto LAB_0012a276;
  }
  QVar5.m_data = psVar3;
  QVar5.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar5);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_30;
LAB_0012a276:
  (__return_storage_ptr__->d).ptr = local_28;
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString FileHdrWrapper::getFieldName(size_t fieldId)
{
    switch (fieldId) {
         case MACHINE: return("Machine");
         case SEC_NUM: return ("Sections Count");
         case TIMESTAMP: {
            PEFile* myPe = dynamic_cast<PEFile*>(this->m_Exe);
            if (myPe && myPe->isReproBuild()) {
                return "ReproChecksum";
            }
            return("Time Date Stamp");
         }
         case SYMBOL_PTR: return("Ptr to Symbol Table");
         case SYMBOL_NUM: return("Num. of Symbols");
         case OPTHDR_SIZE: return("Size of OptionalHeader");
         case CHARACT: return("Characteristics");
    }
    return "";
}